

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

precise_unit units::default_unit(string *unit_type)

{
  char cVar1;
  char *pcVar2;
  size_type sVar3;
  precise_unit pVar4;
  precise_unit pVar5;
  precise_unit pVar6;
  bool bVar7;
  int iVar8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var9;
  const_iterator cVar10;
  long lVar11;
  ulong uVar12;
  string *this;
  size_type sVar13;
  long *plVar14;
  precise_unit pVar15;
  undefined8 uStack_220;
  allocator local_211;
  double local_210;
  precise_unit tunit;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  if ((default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_ == '\0') &&
     (iVar8 = __cxa_guard_acquire(&default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_)
     , iVar8 != 0)) {
    default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_._M_h._M_buckets =
         &default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_._M_h._M_single_bucket;
    default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_._M_h._M_bucket_count = 1;
    default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)0x0;
    default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_._M_h._M_element_count = 0;
    default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_._M_h._M_rehash_policy.
    _M_max_load_factor = 1.0;
    default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_._M_h._M_rehash_policy._4_4_ = 0
    ;
    default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_._M_h._M_rehash_policy.
    _M_next_resize = 0;
    default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_._M_h._M_single_bucket =
         (__node_base_ptr)0x0;
    plVar14 = &defined_measurement_types;
    for (lVar11 = 0x1788; lVar11 != 0; lVar11 = lVar11 + -0x18) {
      if (*plVar14 != 0) {
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,units::precise_unit>,std::allocator<std::pair<std::__cxx11::string_const,units::precise_unit>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<char_const*const&,units::precise_unit_const&>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,units::precise_unit>,std::allocator<std::pair<std::__cxx11::string_const,units::precise_unit>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_,plVar14,
                   plVar14 + 1);
      }
      plVar14 = plVar14 + 3;
    }
    __cxa_atexit(std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
                 ::~unordered_map,&default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_);
  }
  pcVar2 = (unit_type->_M_dataplus)._M_p;
  sVar3 = unit_type->_M_string_length;
  if (sVar3 != 1) goto switchD_001630a8_caseD_4b;
  cVar1 = *pcVar2;
  switch(cVar1) {
  case 'I':
    pVar4.base_units_ = (unit_data)0x800;
    pVar4.commodity_ = 0;
    pVar4.multiplier_ = 1.0;
    break;
  case 'J':
    pVar4.base_units_ = (unit_data)0x4000;
    pVar4.commodity_ = 0;
    pVar4.multiplier_ = 1.0;
    break;
  case 'K':
  case 'O':
  case 'P':
  case 'Q':
  case 'R':
  case 'S':
    goto switchD_001630a8_caseD_4b;
  case 'L':
    uStack_220 = 1;
    goto LAB_00163263;
  case 'M':
    pVar4.base_units_ = (unit_data)0x100;
    pVar4.commodity_ = 0;
    pVar4.multiplier_ = 1.0;
    break;
  case 'N':
    pVar4.base_units_ = (unit_data)0x80000;
    pVar4.commodity_ = 0;
    pVar4.multiplier_ = 1.0;
    break;
  case 'T':
    uStack_220 = 0x10;
LAB_00163263:
    pVar4.base_units_ = (unit_data)(undefined4)uStack_220;
    pVar4.commodity_ = uStack_220._4_4_;
    pVar4.multiplier_ = 1.0;
    break;
  default:
    if (cVar1 == 'l') {
      return (precise_unit)ZEXT816(0x3ff0000000000000);
    }
    if (cVar1 == -0x38) {
      pVar15.base_units_ = (unit_data)0x10000;
      pVar15.commodity_ = 0;
      pVar15.multiplier_ = 1.0;
      return pVar15;
    }
switchD_001630a8_caseD_4b:
    for (sVar13 = 0; sVar3 != sVar13; sVar13 = sVar13 + 1) {
      iVar8 = tolower((int)pcVar2[sVar13]);
      pcVar2[sVar13] = (char)iVar8;
    }
    _Var9._M_current = (unit_type->_M_dataplus)._M_p;
    tunit.multiplier_._0_1_ = 0x20;
    _Var9 = std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (_Var9,_Var9._M_current + unit_type->_M_string_length,
                       (_Iter_equals_val<const_char>)&tunit);
    std::__cxx11::string::erase
              (unit_type,_Var9._M_current,
               (unit_type->_M_dataplus)._M_p + unit_type->_M_string_length);
    cVar10 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(&default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_._M_h,unit_type
                   );
    if (cVar10.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
        ._M_cur != (__node_type *)0x0) {
      return *(precise_unit *)
              ((long)cVar10.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
                     ._M_cur + 0x28);
    }
    pcVar2 = (unit_type->_M_dataplus)._M_p;
    if (*pcVar2 == '{') {
      if (pcVar2[unit_type->_M_string_length - 1] != '}') goto LAB_00163199;
LAB_0016314f:
      std::__cxx11::string::pop_back();
      std::__cxx11::string::substr((ulong)&local_48,(ulong)unit_type);
      pVar15 = default_unit(&local_48);
      this = &local_48;
    }
    else {
      if ((*pcVar2 == '[') && (pcVar2[unit_type->_M_string_length - 1] == ']')) goto LAB_0016314f;
LAB_00163199:
      iVar8 = std::__cxx11::string::compare((ulong)unit_type,0,(char *)0xa);
      if (iVar8 == 0) {
        std::__cxx11::string::substr((ulong)&local_68,(ulong)unit_type);
        pVar15 = default_unit(&local_68);
        this = &local_68;
      }
      else {
        iVar8 = std::__cxx11::string::compare((ulong)unit_type,0,(char *)0x9);
        if (iVar8 == 0) {
          std::__cxx11::string::substr((ulong)&local_88,(ulong)unit_type);
          pVar15 = default_unit(&local_88);
          this = &local_88;
        }
        else {
          iVar8 = std::__cxx11::string::compare((ulong)unit_type,0,(char *)0x6);
          if (iVar8 == 0) {
            std::__cxx11::string::substr((ulong)&local_a8,(ulong)unit_type);
            tunit = default_unit(&local_a8);
            pVar15 = precise_unit::operator/(&tunit,(precise_unit *)precise::s);
            this = &local_a8;
          }
          else {
            lVar11 = std::__cxx11::string::rfind((char *)unit_type,0x1752dc);
            if (lVar11 == -1) {
              lVar11 = std::__cxx11::string::find_first_of((char *)unit_type,0x1752e6);
              if (lVar11 == -1) {
                iVar8 = std::__cxx11::string::compare((ulong)unit_type,0,(char *)0x3);
                if (iVar8 == 0) {
                  std::__cxx11::string::substr((ulong)&local_108,(ulong)unit_type);
                  pVar15 = default_unit(&local_108);
                  local_210 = pVar15.multiplier_;
                  tunit = pVar15;
                  std::__cxx11::string::~string((string *)&local_108);
                  if (pVar15.base_units_ != (unit_data)0xfa94a488 && !NAN(local_210)) {
                    pVar15 = precise_unit::inv(&tunit);
                    return pVar15;
                  }
                }
                std::__cxx11::string::string((string *)&tunit,"rto",&local_211);
                bVar7 = ends_with(unit_type,(string *)&tunit);
                std::__cxx11::string::~string((string *)&tunit);
                if (!bVar7) {
                  std::__cxx11::string::string((string *)&tunit,"fr",&local_211);
                  bVar7 = ends_with(unit_type,(string *)&tunit);
                  std::__cxx11::string::~string((string *)&tunit);
                  if (!bVar7) {
                    std::__cxx11::string::string((string *)&tunit,"quantity",&local_211);
                    bVar7 = ends_with(unit_type,(string *)&tunit);
                    std::__cxx11::string::~string((string *)&tunit);
                    if (bVar7) {
                      std::__cxx11::string::substr((ulong)&local_128,(ulong)unit_type);
                      pVar15 = default_unit(&local_128);
                      this = &local_128;
                    }
                    else {
                      std::__cxx11::string::string((string *)&tunit,"quantities",&local_211);
                      bVar7 = ends_with(unit_type,(string *)&tunit);
                      std::__cxx11::string::~string((string *)&tunit);
                      if (bVar7) {
                        std::__cxx11::string::substr((ulong)&local_148,(ulong)unit_type);
                        pVar15 = default_unit(&local_148);
                        this = &local_148;
                      }
                      else {
                        std::__cxx11::string::string((string *)&tunit,"measure",&local_211);
                        bVar7 = ends_with(unit_type,(string *)&tunit);
                        std::__cxx11::string::~string((string *)&tunit);
                        if (bVar7) {
                          std::__cxx11::string::substr((ulong)&local_168,(ulong)unit_type);
                          pVar15 = default_unit(&local_168);
                          this = &local_168;
                        }
                        else {
                          std::__cxx11::string::string((string *)&tunit,"size",&local_211);
                          bVar7 = ends_with(unit_type,(string *)&tunit);
                          std::__cxx11::string::~string((string *)&tunit);
                          if (bVar7) {
                            std::__cxx11::string::substr((ulong)&local_188,(ulong)unit_type);
                            pVar15 = default_unit(&local_188);
                            this = &local_188;
                          }
                          else if ((unit_type->_M_string_length < 2) ||
                                  ((unit_type->_M_dataplus)._M_p[unit_type->_M_string_length - 1] !=
                                   's')) {
                            std::__cxx11::string::string((string *)&tunit,"rate",&local_211);
                            bVar7 = ends_with(unit_type,(string *)&tunit);
                            std::__cxx11::string::~string((string *)&tunit);
                            if (!bVar7) {
                              std::__cxx11::string::string((string *)&local_1e8,(string *)unit_type)
                              ;
                              pVar15 = unit_from_string(&local_1e8,0x8000000);
                              local_210 = pVar15.multiplier_;
                              std::__cxx11::string::~string((string *)&local_1e8);
                              uVar12 = pVar15._8_8_ & 0xffffffff;
                              if (uVar12 == 0xfa94a488 && NAN(local_210)) {
                                pVar6.base_units_ = (unit_data)0xfa94a488;
                                pVar6.commodity_ = 0;
                                pVar6.multiplier_ = NAN;
                                return pVar6;
                              }
                              goto LAB_00163474;
                            }
                            std::__cxx11::string::substr((ulong)&local_1c8,(ulong)unit_type);
                            tunit = default_unit(&local_1c8);
                            pVar15 = precise_unit::operator/(&tunit,(precise_unit *)precise::s);
                            this = &local_1c8;
                          }
                          else {
                            std::__cxx11::string::pop_back();
                            std::__cxx11::string::string((string *)&local_1a8,(string *)unit_type);
                            pVar15 = default_unit(&local_1a8);
                            this = &local_1a8;
                          }
                        }
                      }
                    }
                    goto LAB_00163373;
                  }
                }
                uVar12 = 0;
LAB_00163474:
                pVar5.base_units_ = (unit_data)(int)uVar12;
                pVar5.commodity_ = (int)(uVar12 >> 0x20);
                pVar5.multiplier_ = 1.0;
                return pVar5;
              }
              std::__cxx11::string::substr((ulong)&local_e8,(ulong)unit_type);
              pVar15 = default_unit(&local_e8);
              this = &local_e8;
            }
            else {
              std::__cxx11::string::substr((ulong)&local_c8,(ulong)unit_type);
              pVar15 = default_unit(&local_c8);
              this = &local_c8;
            }
          }
        }
      }
    }
LAB_00163373:
    local_210 = pVar15.multiplier_;
    std::__cxx11::string::~string((string *)this);
    pVar4.base_units_ = (unit_data)(int)pVar15._8_8_;
    pVar4.commodity_ = (int)((ulong)pVar15._8_8_ >> 0x20);
    pVar4.multiplier_ = local_210;
  }
  return pVar4;
}

Assistant:

precise_unit default_unit(std::string unit_type)
{
    static const smap measurement_types = loadDefinedMeasurementTypes();

    if (unit_type.size() == 1) {
        switch (unit_type[0]) {
            case 'L':
                return precise::m;
            case 'M':
                return precise::kg;
            case 'T':
                return precise::second;
            case '\xC8':
                return precise::Kelvin;
            case 'I':
                return precise::A;
            case 'N':
                return precise::mol;
            case 'J':
                return precise::cd;
            case 'l':
                return precise::one;
        }
    }
    std::transform(
        unit_type.begin(), unit_type.end(), unit_type.begin(), ::tolower);
    unit_type.erase(
        std::remove(unit_type.begin(), unit_type.end(), ' '), unit_type.end());
    auto fnd = measurement_types.find(unit_type);
    if (fnd != measurement_types.end()) {
        return fnd->second;
    }
    if ((unit_type.front() == '[' && unit_type.back() == ']') ||
        (unit_type.front() == '{' && unit_type.back() == '}')) {
        unit_type.pop_back();
        return default_unit(unit_type.substr(1));
    }
    if (unit_type.compare(0, 10, "quantityof") == 0) {
        return default_unit(unit_type.substr(10));
    }
    if (unit_type.compare(0, 9, "measureof") == 0) {
        return default_unit(unit_type.substr(9));
    }
    if (unit_type.compare(0, 6, "rateof") == 0) {
        return default_unit(unit_type.substr(6)) / precise::s;
    }
    auto fof = unit_type.rfind("of");
    if (fof != std::string::npos) {
        return default_unit(unit_type.substr(0, fof));
    }
    fof = unit_type.find_first_of("([{");
    if (fof != std::string::npos) {
        return default_unit(unit_type.substr(0, fof));
    }
    if (unit_type.compare(0, 3, "inv") == 0) {
        auto tunit = default_unit(unit_type.substr(3));
        if (!is_error(tunit)) {
            return tunit.inv();
        }
    }
    if (ends_with(unit_type, "rto")) {
        // ratio of some kind
        return precise::one;
    }
    if (ends_with(unit_type, "fr")) {
        // ratio of some kind
        return precise::one;
    }
    if (ends_with(unit_type, "quantity")) {
        return default_unit(
            unit_type.substr(0, unit_type.size() - strlen("quantity")));
    }
    if (ends_with(unit_type, "quantities")) {
        return default_unit(
            unit_type.substr(0, unit_type.size() - strlen("quantities")));
    }
    if (ends_with(unit_type, "measure")) {
        return default_unit(
            unit_type.substr(0, unit_type.size() - strlen("measure")));
    }
    if (ends_with(unit_type, "size")) {
        return default_unit(
            unit_type.substr(0, unit_type.size() - strlen("size")));
    }
    if (unit_type.back() == 's' && unit_type.size() > 1) {
        unit_type.pop_back();
        return default_unit(unit_type);
    }
    if (ends_with(unit_type, "rate")) {
        return default_unit(
                   unit_type.substr(0, unit_type.size() - strlen("rate"))) /
            precise::s;
    }
    auto retunit = unit_from_string(unit_type, no_default_units);
    if (is_valid(retunit)) {
        return precise_unit(retunit.base_units());
    }
    return precise::invalid;
}